

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<kj::String,kj::String>
          (StringTree *__return_storage_ptr__,kj *this,String *params,String *params_1)

{
  String *pSVar1;
  StringTree local_90;
  StringTree local_58;
  String *local_20;
  String *params_local_1;
  String *params_local;
  
  local_20 = params;
  params_local_1 = (String *)this;
  params_local = (String *)__return_storage_ptr__;
  pSVar1 = fwd<kj::String>((NoInfer<kj::String> *)this);
  _::toStringTreeOrCharSequence(&local_58,pSVar1);
  pSVar1 = fwd<kj::String>(local_20);
  _::toStringTreeOrCharSequence(&local_90,pSVar1);
  StringTree::concat<kj::StringTree,kj::StringTree>
            (__return_storage_ptr__,&local_58,&local_90,(StringTree *)params_1);
  StringTree::~StringTree(&local_90);
  StringTree::~StringTree(&local_58);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}